

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

Error __thiscall
llvm::DWARFDebugLine::Prologue::parse
          (Prologue *this,DWARFDataExtractor *DebugLineData,uint64_t *OffsetPtr,DWARFContext *Ctx,
          DWARFUnit *U)

{
  size_t *psVar1;
  uint8_t *puVar2;
  FormParams Params;
  int iVar3;
  iterator __position;
  iterator iVar4;
  iterator iVar5;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar6;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar7;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar9;
  uint8_t uVar10;
  byte bVar11;
  bool bVar12;
  uint16_t uVar13;
  char *pcVar14;
  uint64_t uVar15;
  ulong uVar16;
  char acVar17 [8];
  Prologue *pPVar18;
  DWARFUnit *in_R9;
  uint uVar19;
  undefined8 uVar20;
  StringRef SVar21;
  OptionalStorage<unsigned_long,_true> OVar22;
  Optional<unsigned_long> OVar23;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  Optional<llvm::ArrayRef<unsigned_char>_> local_1e0;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>_2 local_1c8;
  char local_1b8;
  anon_union_48_2_427f0595_for_Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>_2
  local_1b0;
  byte local_180;
  vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
  *local_178;
  anon_union_48_2_427f0595_for_Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>_2
  local_170;
  byte local_140;
  undefined1 auStack_138 [8];
  uint8_t OpLen;
  undefined4 uStack_12c;
  anon_union_8_3_82d75f4a_for_ValueType_0 aStack_128;
  uint8_t *puStack_120;
  DWARFUnit *local_118;
  DWARFUnit *pDStack_110;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_108;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aStack_100;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_f8;
  uchar local_f0 [8];
  uchar auStack_e8 [8];
  ulong local_e0;
  anon_union_8_3_82d75f4a_for_ValueType_0 aStack_d8;
  anon_union_8_3_82d75f4a_for_ValueType_0 aStack_d0;
  uint8_t *puStack_c8;
  DWARFUnit *local_c0;
  DWARFUnit *pDStack_b8;
  undefined1 auStack_b0 [8];
  DWARFFormValue Value_1;
  uint64_t EndPrologueOffset;
  _func_int **local_70;
  uint64_t PrologueOffset;
  DWARFUnit *local_60;
  char local_58 [8];
  Prologue *local_50;
  uint local_48;
  uint local_44;
  char local_40 [8];
  AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
  local_38;
  Error e;
  
  local_70 = (Ctx->super_DIContext)._vptr_DIContext;
  local_60 = in_R9;
  local_50 = this;
  clear((Prologue *)DebugLineData);
  pcVar14 = (char *)DWARFDataExtractor::getRelocatedValue
                              ((DWARFDataExtractor *)OffsetPtr,4,(uint64_t *)Ctx,(uint64_t *)0x0,
                               (Error *)0x0);
  (DebugLineData->super_DataExtractor).Data.Data = pcVar14;
  if (pcVar14 == (char *)0xffffffff) {
    *(undefined1 *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 3) = 1;
    pcVar14 = (char *)DataExtractor::getU64((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0)
    ;
    (DebugLineData->super_DataExtractor).Data.Data = pcVar14;
  }
  else if (0xffffffe < (ulong)pcVar14 >> 4) {
    pcVar14 = (char *)std::_V2::generic_category();
    pPVar18 = local_50;
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = local_50;
    createStringError<unsigned_long,unsigned_long>
              (EC,pcVar14,
               (unsigned_long *)
               "parsing line table prologue at offset 0x%8.8lx unsupported reserved unit length found of value 0x%8.8lx"
               ,(unsigned_long *)&local_70);
    return (Error)(ErrorInfoBase *)pPVar18;
  }
  uVar13 = DataExtractor::getU16((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
  *(uint16_t *)&(DebugLineData->super_DataExtractor).Data.Length = uVar13;
  if (uVar13 < 2) {
    pcVar14 = (char *)std::_V2::generic_category();
    pPVar18 = local_50;
    auStack_138._0_2_ = uVar13;
    EC_00._M_cat = (error_category *)0x5f;
    EC_00._0_8_ = local_50;
    createStringError<unsigned_long,unsigned_short>
              (EC_00,pcVar14,
               (unsigned_long *)
               "parsing line table prologue at offset 0x%8.8lx found unsupported version 0x%2.2x",
               (unsigned_short *)&local_70);
  }
  else {
    if (4 < uVar13) {
      uVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      *(uint8_t *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 2) = uVar10;
      if (*(uint8_t *)((long)OffsetPtr + 0x11) != '\0' &&
          *(uint8_t *)((long)OffsetPtr + 0x11) != uVar10) {
        __assert_fail("(DebugLineData.getAddressSize() == 0 || DebugLineData.getAddressSize() == getAddressSize()) && \"Line table header and data extractor disagree\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                      ,0x162,
                      "Error llvm::DWARFDebugLine::Prologue::parse(const DWARFDataExtractor &, uint64_t *, const DWARFContext &, const DWARFUnit *)"
                     );
      }
      uVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      *(uint8_t *)&DebugLineData->Obj = uVar10;
    }
    uVar15 = DWARFDataExtractor::getRelocatedValue
                       ((DWARFDataExtractor *)OffsetPtr,
                        (uint)(*(char *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 3
                                        ) == '\x01') * 4 + 4,(uint64_t *)Ctx,(uint64_t *)0x0,
                        (Error *)0x0);
    (DebugLineData->super_DataExtractor).IsLittleEndian = (char)uVar15;
    (DebugLineData->super_DataExtractor).AddressSize = (char)(uVar15 >> 8);
    *(int6 *)&(DebugLineData->super_DataExtractor).field_0x12 = (int6)(uVar15 >> 0x10);
    Value_1.C = (DWARFContext *)(uVar15 + (long)(Ctx->super_DIContext)._vptr_DIContext);
    local_40 = (char  [8])Value_1.C;
    uVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 1) = uVar10;
    if (3 < (ushort)(DebugLineData->super_DataExtractor).Data.Length) {
      uVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      *(uint8_t *)((long)&DebugLineData->Obj + 2) = uVar10;
    }
    uVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 3) = uVar10;
    uVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 4) = uVar10;
    uVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 5) = uVar10;
    bVar11 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(byte *)((long)&DebugLineData->Obj + 6) = bVar11;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(DebugLineData + 1),
               (ulong)bVar11 - 1);
    if (1 < *(byte *)((long)&DebugLineData->Obj + 6)) {
      uVar19 = 1;
      do {
        uVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
        auStack_138[0] = uVar10;
        __position._M_current = (uchar *)DebugLineData[1].super_DataExtractor.Data.Length;
        if (__position._M_current == *(uchar **)&DebugLineData[1].super_DataExtractor.IsLittleEndian
           ) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)(DebugLineData + 1),
                     __position,(uchar *)auStack_138);
        }
        else {
          *__position._M_current = uVar10;
          psVar1 = &DebugLineData[1].super_DataExtractor.Data.Length;
          *psVar1 = *psVar1 + 1;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < *(byte *)((long)&DebugLineData->Obj + 6));
    }
    if ((ushort)(DebugLineData->super_DataExtractor).Data.Length < 5) {
      acVar17 = (char  [8])(Ctx->super_DIContext)._vptr_DIContext;
      if ((ulong)acVar17 < (ulong)local_40) {
        do {
          SVar21 = DataExtractor::getCStrRef((DataExtractor *)OffsetPtr,(uint64_t *)Ctx);
          if (SVar21.Length == 0) {
            acVar17 = (char  [8])(Ctx->super_DIContext)._vptr_DIContext;
            break;
          }
          DWARFFormValue::createFromPValue(DW_FORM_string,SVar21.Data);
          iVar4._M_current = (DWARFFormValue *)DebugLineData[1].Section;
          if (iVar4._M_current == (DWARFFormValue *)DebugLineData[2].super_DataExtractor.Data.Data)
          {
            std::vector<llvm::DWARFFormValue,std::allocator<llvm::DWARFFormValue>>::
            _M_realloc_insert<llvm::DWARFFormValue_const&>
                      ((vector<llvm::DWARFFormValue,std::allocator<llvm::DWARFFormValue>> *)
                       &DebugLineData[1].Obj,iVar4,(DWARFFormValue *)auStack_138);
          }
          else {
            (iVar4._M_current)->U = local_118;
            (iVar4._M_current)->C = (DWARFContext *)pDStack_110;
            ((iVar4._M_current)->Value).data = (uint8_t *)aStack_128;
            ((iVar4._M_current)->Value).SectionIndex = (uint64_t)puStack_120;
            *(undefined1 (*) [8])iVar4._M_current = auStack_138;
            ((iVar4._M_current)->Value).field_0 = _OpLen;
            DebugLineData[1].Section = DebugLineData[1].Section + 3;
          }
          acVar17 = (char  [8])(Ctx->super_DIContext)._vptr_DIContext;
        } while ((ulong)acVar17 < (ulong)local_40);
      }
      if ((ulong)acVar17 < (ulong)local_40) {
        local_60 = (DWARFUnit *)&DebugLineData[2].super_DataExtractor.Data.Length;
        do {
          SVar21 = DataExtractor::getCStrRef((DataExtractor *)OffsetPtr,(uint64_t *)Ctx);
          if (SVar21.Length == 0) break;
          auStack_138 = (undefined1  [8])((ulong)auStack_138 & 0xffffffffffff0000);
          _OpLen = 0;
          aStack_128 = (anon_union_8_3_82d75f4a_for_ValueType_0)0x0;
          local_e0 = local_e0 & 0xffffffffffff0000;
          aStack_d8.uval = 0;
          aStack_d0.uval = 0;
          local_c0 = (DWARFUnit *)0x0;
          pDStack_b8 = (DWARFUnit *)0x0;
          local_108 = (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)0x0;
          aStack_100 = (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)0x0;
          local_118 = (DWARFUnit *)0x0;
          pDStack_110 = (DWARFUnit *)0x0;
          local_f8 = (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)0x0;
          DWARFFormValue::createFromPValue(DW_FORM_string,SVar21.Data);
          uStack_12c = local_170._12_4_;
          _OpLen = local_170._8_4_;
          local_118 = (DWARFUnit *)local_170._32_8_;
          pDStack_110 = (DWARFUnit *)local_170._40_8_;
          aStack_128 = (anon_union_8_3_82d75f4a_for_ValueType_0)local_170._16_8_;
          puStack_120 = (uint8_t *)local_170._24_8_;
          auStack_138 = (undefined1  [8])local_170.ErrorStorage.buffer;
          local_108.value =
               DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
          aStack_100.value =
               DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
          local_f8.value =
               DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
          iVar5._M_current = *(FileNameEntry **)&DebugLineData[2].super_DataExtractor.IsLittleEndian
          ;
          if (iVar5._M_current == (FileNameEntry *)DebugLineData[2].Obj) {
            std::
            vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
            ::_M_realloc_insert<llvm::DWARFDebugLine::FileNameEntry_const&>
                      ((vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
                        *)local_60,iVar5,(FileNameEntry *)auStack_138);
          }
          else {
            memcpy(iVar5._M_current,
                   (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
                    *)auStack_138,0x88);
            puVar2 = &DebugLineData[2].super_DataExtractor.IsLittleEndian;
            *(long *)puVar2 = *(long *)puVar2 + 0x88;
          }
        } while ((Ctx->super_DIContext)._vptr_DIContext < (ulong)local_40);
      }
      *(undefined2 *)((long)&DebugLineData->Obj + 7) = 0x101;
    }
    else {
      local_58[0] = local_40[0];
      local_58[1] = local_40[1];
      local_58[2] = local_40[2];
      local_58[3] = local_40[3];
      local_58[4] = local_40[4];
      local_58[5] = local_40[5];
      local_58[6] = local_40[6];
      local_58[7] = local_40[7];
      parseV5EntryFormat((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>
                          *)&local_170.TStorage,(DWARFDataExtractor *)OffsetPtr,(uint64_t *)Ctx,
                         (uint64_t)local_40,(ContentTypeTracker *)0x0);
      if ((local_140 & 1) == 0) {
        bVar11 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
        if (bVar11 != 0) {
          local_40 = (char  [8])&DebugLineData[1].Obj;
          local_48 = (uint)bVar11;
          uVar19 = 0;
          do {
            if ((ulong)local_58 <= (Ctx->super_DIContext)._vptr_DIContext) {
              pcVar14 = (char *)std::_V2::generic_category();
              EC_05._M_cat = (error_category *)0x16;
              EC_05._0_8_ = &local_38;
              createStringError<unsigned_long,unsigned_long>
                        (EC_05,pcVar14,
                         (unsigned_long *)
                         "failed to parse directory entry at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                         ,(unsigned_long *)Ctx);
              goto LAB_00aefb09;
            }
            local_44 = uVar19;
            if ((local_140 & 1) != 0) goto LAB_00aeffce;
            if ((ulong)(uint)local_170._8_4_ != 0) {
              acVar17 = (char  [8])
                        ((ulong)(uint)local_170._8_4_ * 8 + (long)local_170.ErrorStorage.buffer);
              uVar20 = local_170.ErrorStorage.buffer;
              do {
                auStack_138._0_2_ = *(Form *)(uVar20 + 4);
                _OpLen = 0;
                aStack_128.uval = 0;
                local_118 = (DWARFUnit *)0x0;
                pDStack_110 = (DWARFUnit *)0x0;
                Params = *(FormParams *)&(DebugLineData->super_DataExtractor).Data.Length;
                if (*(int *)uVar20 == 1) {
                  bVar12 = DWARFFormValue::extractValue
                                     ((DWARFFormValue *)auStack_138,(DWARFDataExtractor *)OffsetPtr,
                                      (uint64_t *)Ctx,Params,(DWARFContext *)U,local_60);
                  if (!bVar12) {
LAB_00aefaf0:
                    pcVar14 = (char *)std::_V2::generic_category();
                    EC_01._M_cat = (error_category *)0x16;
                    EC_01._0_8_ = &local_38;
                    createStringError(EC_01,pcVar14);
                    goto LAB_00aefb09;
                  }
                  iVar4._M_current = (DWARFFormValue *)DebugLineData[1].Section;
                  if (iVar4._M_current ==
                      (DWARFFormValue *)DebugLineData[2].super_DataExtractor.Data.Data) {
                    std::vector<llvm::DWARFFormValue,std::allocator<llvm::DWARFFormValue>>::
                    _M_realloc_insert<llvm::DWARFFormValue_const&>
                              ((vector<llvm::DWARFFormValue,std::allocator<llvm::DWARFFormValue>> *)
                               local_40,iVar4,(DWARFFormValue *)auStack_138);
                  }
                  else {
                    (iVar4._M_current)->U = local_118;
                    (iVar4._M_current)->C = (DWARFContext *)pDStack_110;
                    ((iVar4._M_current)->Value).data = (uint8_t *)aStack_128;
                    ((iVar4._M_current)->Value).SectionIndex = (uint64_t)puStack_120;
                    *(undefined4 *)iVar4._M_current = auStack_138._0_4_;
                    *(undefined4 *)&(iVar4._M_current)->field_0x4 = auStack_138._4_4_;
                    *(undefined4 *)&((iVar4._M_current)->Value).field_0 = _OpLen;
                    *(undefined4 *)((long)&((iVar4._M_current)->Value).field_0 + 4) = uStack_12c;
                    DebugLineData[1].Section = DebugLineData[1].Section + 3;
                  }
                }
                else {
                  bVar12 = DWARFFormValue::skipValue
                                     (*(Form *)(uVar20 + 4),*(DataExtractor *)OffsetPtr,
                                      (uint64_t *)Ctx,Params);
                  if (!bVar12) goto LAB_00aefaf0;
                }
                uVar20 = uVar20 + 8;
              } while ((char  [8])uVar20 != acVar17);
            }
            uVar19 = local_44 + 1;
          } while (uVar19 != local_48);
        }
        parseV5EntryFormat((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>
                            *)&local_1b0.TStorage,(DWARFDataExtractor *)OffsetPtr,(uint64_t *)Ctx,
                           (uint64_t)local_58,(ContentTypeTracker *)((long)&DebugLineData->Obj + 7))
        ;
        if ((local_180 & 1) == 0) {
          bVar11 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
          if (bVar11 != 0) {
            local_178 = (vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
                         *)&DebugLineData[2].super_DataExtractor.Data.Length;
            local_48 = (uint)bVar11;
            uVar19 = 0;
            do {
              if ((ulong)local_58 <= (Ctx->super_DIContext)._vptr_DIContext) {
                pcVar14 = (char *)std::_V2::generic_category();
                EC_06._M_cat = (error_category *)0x16;
                EC_06._0_8_ = &local_38;
                createStringError<unsigned_long,unsigned_long>
                          (EC_06,pcVar14,
                           (unsigned_long *)
                           "failed to parse file entry at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                           ,(unsigned_long *)Ctx);
                goto LAB_00aeff1f;
              }
              auStack_138 = (undefined1  [8])((ulong)auStack_138 & 0xffffffffffff0000);
              _OpLen = 0;
              aStack_128.uval = 0;
              local_e0 = local_e0 & 0xffffffffffff0000;
              aStack_d8.uval = 0;
              aStack_d0.uval = 0;
              local_c0 = (DWARFUnit *)0x0;
              pDStack_b8 = (DWARFUnit *)0x0;
              local_108.value = 0;
              aStack_100.value = 0;
              local_118 = (DWARFUnit *)0x0;
              pDStack_110 = (DWARFUnit *)0x0;
              local_f8.value = 0;
              local_44 = uVar19;
              if ((local_180 & 1) != 0) {
LAB_00aeffce:
                __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                              ,0x272,
                              "storage_type *llvm::Expected<llvm::SmallVector<(anonymous namespace)::ContentDescriptor, 4>>::getStorage() [T = llvm::SmallVector<(anonymous namespace)::ContentDescriptor, 4>]"
                             );
              }
              if ((ulong)(uint)local_1b0._8_4_ != 0) {
                local_40 = (char  [8])
                           ((ulong)(uint)local_1b0._8_4_ * 8 + (long)local_1b0.ErrorStorage.buffer);
                uVar20 = local_1b0.ErrorStorage.buffer;
                do {
                  iVar3 = *(int *)uVar20;
                  auStack_b0._0_2_ = *(Form *)(uVar20 + 4);
                  Value_1.Form = 0;
                  Value_1._2_6_ = 0;
                  Value_1.Value.field_0.uval = 0;
                  Value_1.Value.SectionIndex = 0;
                  Value_1.U = (DWARFUnit *)0x0;
                  bVar12 = DWARFFormValue::extractValue
                                     ((DWARFFormValue *)auStack_b0,(DWARFDataExtractor *)OffsetPtr,
                                      (uint64_t *)Ctx,
                                      *(FormParams *)
                                       &(DebugLineData->super_DataExtractor).Data.Length,
                                      (DWARFContext *)U,local_60);
                  if (!bVar12) {
LAB_00aeff06:
                    pcVar14 = (char *)std::_V2::generic_category();
                    EC_04._M_cat = (error_category *)0x16;
                    EC_04._0_8_ = &local_38;
                    createStringError(EC_04,pcVar14);
                    goto LAB_00aeff1f;
                  }
                  aVar6 = local_108;
                  switch(iVar3) {
                  case 1:
                    auStack_138[2] = auStack_b0[2];
                    auStack_138[3] = auStack_b0[3];
                    auStack_138[4] = auStack_b0[4];
                    auStack_138[5] = auStack_b0[5];
                    auStack_138[6] = auStack_b0[6];
                    auStack_138[7] = auStack_b0[7];
                    auStack_138[0] = auStack_b0[0];
                    auStack_138[1] = auStack_b0[1];
                    local_118 = (DWARFUnit *)Value_1.Value.SectionIndex;
                    pDStack_110 = Value_1.U;
                    aStack_128 = Value_1.Value.field_0;
                    puStack_120 = Value_1.Value.data;
                    _OpLen = (anon_union_8_3_82d75f4a_for_ValueType_0)Value_1._0_8_;
                    break;
                  case 2:
                    OVar23 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_b0);
                    aVar6.value = OVar23.Storage.field_0.value;
                    aVar7 = aStack_100;
                    aVar8 = local_f8;
                    if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) !=
                        (undefined1  [16])0x0) break;
                    goto LAB_00aeffed;
                  case 3:
                    OVar22 = (OptionalStorage<unsigned_long,_true>)
                             DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_b0);
                    aVar6 = local_f8;
                    aVar9.value = OVar22.field_0.value;
                    aVar7 = aStack_100;
                    aVar8 = local_f8;
                    goto joined_r0x00aefe70;
                  case 4:
                    OVar22 = (OptionalStorage<unsigned_long,_true>)
                             DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_b0);
                    aVar6.value = OVar22.field_0.value;
                    aVar9 = aStack_100;
                    aVar7 = aStack_100;
                    aVar8 = local_f8;
joined_r0x00aefe70:
                    aStack_100 = aVar9;
                    local_f8 = aVar6;
                    aVar6 = local_108;
                    if (((undefined1  [16])OVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                    {
LAB_00aeffed:
                      local_f8 = aVar8;
                      aStack_100 = aVar7;
                      pcVar14 = 
                      "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                      ;
LAB_00af0019:
                      __assert_fail("hasVal",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                                    ,0xad,pcVar14);
                    }
                    break;
                  case 5:
                    DWARFFormValue::getAsBlock
                              ((Optional<llvm::ArrayRef<unsigned_char>_> *)&local_1c8.value,
                               (DWARFFormValue *)auStack_b0);
                    if (local_1b8 == '\x01') {
                      DWARFFormValue::getAsBlock(&local_1e0,(DWARFFormValue *)auStack_b0);
                      if (local_1e0.Storage.hasVal != false) {
                        if (local_1e0.Storage.field_0.value.Length != 0x10) goto LAB_00aeff06;
                        DWARFFormValue::getAsBlock
                                  ((Optional<llvm::ArrayRef<unsigned_char>_> *)&local_1c8.value,
                                   (DWARFFormValue *)auStack_b0);
                        if (local_1b8 != '\0') {
                          local_f0 = *(uchar (*) [8])local_1c8.value.Data;
                          auStack_e8 = *(uchar (*) [8])(local_1c8.value.Data + 8);
                          aVar6 = local_108;
                          break;
                        }
                      }
                      pcVar14 = 
                      "T &llvm::optional_detail::OptionalStorage<llvm::ArrayRef<unsigned char>>::getValue() & [T = llvm::ArrayRef<unsigned char>]"
                      ;
                      goto LAB_00af0019;
                    }
                    goto LAB_00aeff06;
                  default:
                    if (iVar3 == 0x2001) {
                      local_e0 = CONCAT62(auStack_b0._2_6_,auStack_b0._0_2_);
                      local_c0 = (DWARFUnit *)Value_1.Value.SectionIndex;
                      pDStack_b8 = Value_1.U;
                      aStack_d0 = Value_1.Value.field_0;
                      puStack_c8 = Value_1.Value.data;
                      aStack_d8 = (anon_union_8_3_82d75f4a_for_ValueType_0)Value_1._0_8_;
                    }
                  }
                  local_108 = aVar6;
                  uVar20 = uVar20 + 8;
                } while ((char  [8])uVar20 != local_40);
              }
              iVar5._M_current =
                   *(FileNameEntry **)&DebugLineData[2].super_DataExtractor.IsLittleEndian;
              if (iVar5._M_current == (FileNameEntry *)DebugLineData[2].Obj) {
                std::
                vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
                ::_M_realloc_insert<llvm::DWARFDebugLine::FileNameEntry_const&>
                          (local_178,iVar5,(FileNameEntry *)auStack_138);
              }
              else {
                memcpy(iVar5._M_current,
                       (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
                        *)auStack_138,0x88);
                puVar2 = &DebugLineData[2].super_DataExtractor.IsLittleEndian;
                *(long *)puVar2 = *(long *)puVar2 + 0x88;
              }
              uVar19 = local_44 + 1;
            } while (uVar19 != local_48);
          }
          local_38.buffer[0] = '\x01';
          local_38.buffer[1] = '\0';
          local_38.buffer[2] = '\0';
          local_38.buffer[3] = '\0';
          local_38.buffer[4] = '\0';
          local_38.buffer[5] = '\0';
          local_38.buffer[6] = '\0';
          local_38.buffer[7] = '\0';
LAB_00aeff1f:
          if ((local_180 & 1) == 0) {
            if (local_1b0.ErrorStorage.buffer !=
                (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
                 )((long)local_1b0.TStorage.buffer + 0x10)) {
              free((void *)local_1b0.ErrorStorage.buffer);
            }
          }
          else if (local_1b0.ErrorStorage.buffer != (char  [8])0x0) {
            (**(code **)(*(_func_int **)local_1b0.ErrorStorage.buffer + 8))();
          }
        }
        else {
          local_38.buffer = (char  [8])((ulong)local_1b0.ErrorStorage.buffer | 1);
        }
LAB_00aefb09:
        if ((local_140 & 1) == 0) {
          if (local_170.ErrorStorage.buffer !=
              (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
               )((long)local_170.TStorage.buffer + 0x10)) {
            free((void *)local_170.ErrorStorage.buffer);
          }
        }
        else if (local_170.ErrorStorage.buffer != (char  [8])0x0) {
          (**(code **)(*(long *)local_170.ErrorStorage.buffer + 8))();
        }
      }
      else {
        local_38.buffer = (char  [8])local_170.ErrorStorage.buffer;
      }
      uVar16 = (ulong)local_38.buffer & 0xfffffffffffffffe;
      local_38.buffer = (char  [8])(uVar16 != 0 | uVar16);
      if (uVar16 != 0) {
        pcVar14 = (char *)std::_V2::generic_category();
        EC_02._M_cat = (error_category *)0x16;
        EC_02._0_8_ = &PrologueOffset;
        createStringError<unsigned_long,unsigned_long>
                  (EC_02,pcVar14,
                   (unsigned_long *)
                   "parsing line table prologue at 0x%8.8lx found an invalid directory or file table description at 0x%8.8lx"
                   ,(unsigned_long *)&local_70);
        pPVar18 = local_50;
        local_1b0.ErrorStorage.buffer =
             (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
              )((ulong)local_38.buffer | 1);
        local_38.buffer[0] = '\0';
        local_38.buffer[1] = '\0';
        local_38.buffer[2] = '\0';
        local_38.buffer[3] = '\0';
        local_38.buffer[4] = '\0';
        local_38.buffer[5] = '\0';
        local_38.buffer[6] = '\0';
        local_38.buffer[7] = '\0';
        local_170.ErrorStorage.buffer =
             (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
              )(PrologueOffset | 1);
        PrologueOffset = 0;
        ErrorList::join((ErrorList *)local_50,(Error *)&local_170.TStorage,
                        (Error *)&local_1b0.TStorage);
        if ((long *)((ulong)local_1b0.ErrorStorage.buffer & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_1b0.ErrorStorage.buffer & 0xfffffffffffffffe) + 8))();
        }
        if ((long *)((ulong)local_170.ErrorStorage.buffer & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_170.ErrorStorage.buffer & 0xfffffffffffffffe) + 8))();
        }
        if ((long *)(PrologueOffset & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)(PrologueOffset & 0xfffffffffffffffe) + 8))();
        }
        if ((long *)((ulong)local_38.buffer & 0xfffffffffffffffe) == (long *)0x0) {
          return (Error)(ErrorInfoBase *)pPVar18;
        }
        (**(code **)(*(long *)((ulong)local_38.buffer & 0xfffffffffffffffe) + 8))();
        return (Error)(ErrorInfoBase *)pPVar18;
      }
    }
    if ((DWARFContext *)(Ctx->super_DIContext)._vptr_DIContext == Value_1.C) {
      local_50->TotalLength = (uint64_t)&DAT_00000001;
      pPVar18 = local_50;
    }
    else {
      pcVar14 = (char *)std::_V2::generic_category();
      pPVar18 = local_50;
      EC_03._M_cat = (error_category *)0x16;
      EC_03._0_8_ = local_50;
      createStringError<unsigned_long,unsigned_long,unsigned_long>
                (EC_03,pcVar14,
                 (unsigned_long *)
                 "parsing line table prologue at 0x%8.8lx should have ended at 0x%8.8lx but it ended at 0x%8.8lx"
                 ,(unsigned_long *)&local_70,(unsigned_long *)&Value_1.C);
    }
  }
  return (Error)(ErrorInfoBase *)pPVar18;
}

Assistant:

Error DWARFDebugLine::Prologue::parse(const DWARFDataExtractor &DebugLineData,
                                      uint64_t *OffsetPtr,
                                      const DWARFContext &Ctx,
                                      const DWARFUnit *U) {
  const uint64_t PrologueOffset = *OffsetPtr;

  clear();
  TotalLength = DebugLineData.getRelocatedValue(4, OffsetPtr);
  if (TotalLength == dwarf::DW_LENGTH_DWARF64) {
    FormParams.Format = dwarf::DWARF64;
    TotalLength = DebugLineData.getU64(OffsetPtr);
  } else if (TotalLength >= dwarf::DW_LENGTH_lo_reserved) {
    return createStringError(errc::invalid_argument,
        "parsing line table prologue at offset 0x%8.8" PRIx64
        " unsupported reserved unit length found of value 0x%8.8" PRIx64,
        PrologueOffset, TotalLength);
  }
  FormParams.Version = DebugLineData.getU16(OffsetPtr);
  if (getVersion() < 2)
    return createStringError(errc::not_supported,
                       "parsing line table prologue at offset 0x%8.8" PRIx64
                       " found unsupported version 0x%2.2" PRIx16,
                       PrologueOffset, getVersion());

  if (getVersion() >= 5) {
    FormParams.AddrSize = DebugLineData.getU8(OffsetPtr);
    assert((DebugLineData.getAddressSize() == 0 ||
            DebugLineData.getAddressSize() == getAddressSize()) &&
           "Line table header and data extractor disagree");
    SegSelectorSize = DebugLineData.getU8(OffsetPtr);
  }

  PrologueLength =
      DebugLineData.getRelocatedValue(sizeofPrologueLength(), OffsetPtr);
  const uint64_t EndPrologueOffset = PrologueLength + *OffsetPtr;
  MinInstLength = DebugLineData.getU8(OffsetPtr);
  if (getVersion() >= 4)
    MaxOpsPerInst = DebugLineData.getU8(OffsetPtr);
  DefaultIsStmt = DebugLineData.getU8(OffsetPtr);
  LineBase = DebugLineData.getU8(OffsetPtr);
  LineRange = DebugLineData.getU8(OffsetPtr);
  OpcodeBase = DebugLineData.getU8(OffsetPtr);

  StandardOpcodeLengths.reserve(OpcodeBase - 1);
  for (uint32_t I = 1; I < OpcodeBase; ++I) {
    uint8_t OpLen = DebugLineData.getU8(OffsetPtr);
    StandardOpcodeLengths.push_back(OpLen);
  }

  if (getVersion() >= 5) {
    if (Error e = parseV5DirFileTables(
            DebugLineData, OffsetPtr, EndPrologueOffset, FormParams, Ctx, U,
            ContentTypes, IncludeDirectories, FileNames)) {
      return joinErrors(
          createStringError(
              errc::invalid_argument,
              "parsing line table prologue at 0x%8.8" PRIx64
              " found an invalid directory or file table description at"
              " 0x%8.8" PRIx64,
              PrologueOffset, *OffsetPtr),
          std::move(e));
    }
  } else
    parseV2DirFileTables(DebugLineData, OffsetPtr, EndPrologueOffset,
                         ContentTypes, IncludeDirectories, FileNames);

  if (*OffsetPtr != EndPrologueOffset)
    return createStringError(errc::invalid_argument,
                       "parsing line table prologue at 0x%8.8" PRIx64
                       " should have ended at 0x%8.8" PRIx64
                       " but it ended at 0x%8.8" PRIx64,
                       PrologueOffset, EndPrologueOffset, *OffsetPtr);
  return Error::success();
}